

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O2

int32 gauden_mean_reload(gauden_t *g,char *meanfile)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  char *fmt;
  long ln;
  int32 d;
  int32 f;
  int32 *flen;
  int32 m;
  
  if (g->mean == (vector_t ***)0x0) {
    __assert_fail("g->mean != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                  ,0x1c3,"int32 gauden_mean_reload(gauden_t *, const char *)");
  }
  gauden_param_read(&g->mean,&m,&f,&d,&flen,meanfile);
  if (((m == g->n_mgau) && (f == g->n_feat)) && (d == g->n_density)) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)f;
    if (f < 1) {
      uVar3 = uVar4;
    }
    do {
      if (uVar3 == uVar4) {
        ckd_free(flen);
        return 0;
      }
      piVar1 = g->featlen + uVar4;
      piVar2 = flen + uVar4;
      uVar4 = uVar4 + 1;
    } while (*piVar1 == *piVar2);
    fmt = "Feature lengths for original and new means differ\n";
    ln = 0x1cd;
  }
  else {
    fmt = "Mixture-gaussians dimensions for original and new means differ\n";
    ln = 0x1ca;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,ln,fmt);
  exit(1);
}

Assistant:

int32
gauden_mean_reload(gauden_t * g, const char *meanfile)
{
    int32 i, m, f, d, *flen;

    assert(g->mean != NULL);

    gauden_param_read(&(g->mean), &m, &f, &d, &flen, meanfile);

    /* Verify original and new mean parameter dimensions */
    if ((m != g->n_mgau) || (f != g->n_feat) || (d != g->n_density))
        E_FATAL
            ("Mixture-gaussians dimensions for original and new means differ\n");
    for (i = 0; i < g->n_feat; i++)
        if (g->featlen[i] != flen[i])
            E_FATAL("Feature lengths for original and new means differ\n");
    ckd_free(flen);

    return 0;
}